

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall V2Transport::SetReceiveState(V2Transport *this,RecvState recv_state)

{
  long lVar1;
  char *func;
  char in_SIL;
  bool *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 uVar2;
  char *in_stack_ffffffffffffffd0;
  int line;
  undefined7 in_stack_ffffffffffffffe0;
  bool *val;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  val = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            (in_RDI,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             (AnnotatedMixin<std::mutex> *)0x2094db);
  func = (char *)(ulong)in_RDI[0x518];
  line = (int)((ulong)in_RDI >> 0x20);
  switch(func) {
  case (char *)0x0:
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffcc);
    if (in_SIL != '\x01') {
      uVar2 = CONCAT13(in_SIL == '\x06',(int3)in_stack_ffffffffffffffcc);
    }
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,func,
               (char *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
    break;
  case (char *)0x1:
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,func,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  case (char *)0x2:
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,func,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  case (char *)0x3:
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,func,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  case (char *)0x4:
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,func,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  case (char *)0x5:
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,func,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  case (char *)0x6:
    inline_assertion_check<false,bool>
              (val,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),line,func,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  in_RDI[0x518] = (bool)in_SIL;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void V2Transport::SetReceiveState(RecvState recv_state) noexcept
{
    AssertLockHeld(m_recv_mutex);
    // Enforce allowed state transitions.
    switch (m_recv_state) {
    case RecvState::KEY_MAYBE_V1:
        Assume(recv_state == RecvState::KEY || recv_state == RecvState::V1);
        break;
    case RecvState::KEY:
        Assume(recv_state == RecvState::GARB_GARBTERM);
        break;
    case RecvState::GARB_GARBTERM:
        Assume(recv_state == RecvState::VERSION);
        break;
    case RecvState::VERSION:
        Assume(recv_state == RecvState::APP);
        break;
    case RecvState::APP:
        Assume(recv_state == RecvState::APP_READY);
        break;
    case RecvState::APP_READY:
        Assume(recv_state == RecvState::APP);
        break;
    case RecvState::V1:
        Assume(false); // V1 state cannot be left
        break;
    }
    // Change state.
    m_recv_state = recv_state;
}